

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-io.h
# Opt level: O2

void __thiscall
mp::SolutionWriterImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter>::
HandleFeasibleSolution
          (SolutionWriterImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter> *this,
          int status,CStringRef message,double *values,double *dual_values,double param_5)

{
  char *__s;
  StrictMockProblemBuilder *pSVar1;
  TestSolver *pTVar2;
  int iVar3;
  Result RVar4;
  size_t sVar5;
  CStringRef filename_00;
  char *str;
  SolutionAdapter<StrictMockProblemBuilder> sol;
  MemoryWriter filename;
  _Vector_base<double,_std::allocator<double>_> local_378;
  double *local_360;
  size_t sStack_358;
  _Vector_base<long,_std::allocator<long>_> local_348;
  long *local_330;
  size_t sStack_328;
  _Vector_base<double,_std::allocator<double>_> local_318;
  double *local_300;
  size_t local_2f8;
  SolutionAdapter<StrictMockProblemBuilder> local_2f0;
  BasicMemoryWriter<char,_std::allocator<char>_> local_258;
  
  this->num_solutions_ = this->num_solutions_ + 1;
  __s = (this->solver_->super_Solver).super_BasicSolver.solution_stub_._M_dataplus._M_p;
  if (*__s != '\0') {
    pSVar1 = this->builder_;
    local_348._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_348._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_348._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_330 = (this->options_).data_;
    sStack_328 = (this->options_).size_;
    RVar4 = 0;
    iVar3 = 0;
    if (values != (double *)0x0) {
      iVar3 = MockProblemBuilder::num_vars
                        (&(pSVar1->super_StrictMock<MockProblemBuilder>).super_MockProblemBuilder);
    }
    sStack_358 = (size_t)iVar3;
    local_378._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_378._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_378._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_360 = values;
    if (dual_values != (double *)0x0) {
      RVar4 = MockProblemBuilder::num_algebraic_cons
                        (&(this->builder_->super_StrictMock<MockProblemBuilder>).
                          super_MockProblemBuilder);
    }
    local_2f8 = (size_t)RVar4;
    local_318._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_318._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_318._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pTVar2 = this->solver_;
    if (((pTVar2->super_Solver).super_BasicSolver.opts_read_ != true) ||
       (local_2f0.objno_ = 0, (pTVar2->super_Solver).super_BasicSolver.obj_added_ == true)) {
      iVar3 = (pTVar2->super_Solver).super_BasicSolver.objno_;
      local_2f0.objno_ = -iVar3;
      if (0 < iVar3) {
        local_2f0.objno_ = iVar3;
      }
    }
    local_2f0.options_.save_.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2f0.options_.save_.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_2f0.options_.save_.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2f0.options_.data_ = local_330;
    local_2f0.options_.size_ = sStack_328;
    local_2f0.values_.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2f0.values_.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_2f0.values_.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2f0.values_.data_ = local_360;
    local_2f0.values_.size_ = sStack_358;
    local_2f0.dual_values_.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2f0.dual_values_.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_2f0.dual_values_.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_300 = dual_values;
    local_2f0.status_ = status;
    local_2f0.builder_ = pSVar1;
    local_2f0.message_ = message.data_;
    local_2f0.dual_values_.data_ = dual_values;
    local_2f0.dual_values_.size_ = local_2f8;
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_318);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_378);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_348);
    local_258.super_BasicWriter<char>._vptr_BasicWriter =
         (_func_int **)&PTR__BasicMemoryWriter_0025b1f8;
    local_258.buffer_.super_Buffer<char>.ptr_ = local_258.buffer_.data_;
    local_258.buffer_.super_Buffer<char>.size_ = 0;
    local_258.buffer_.super_Buffer<char>.capacity_ = 500;
    local_258.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_0025b240;
    local_258.super_BasicWriter<char>.buffer_ = &local_258.buffer_.super_Buffer<char>;
    sVar5 = strlen(__s);
    fmt::Buffer<char>::append<char>(&local_258.buffer_.super_Buffer<char>,__s,__s + sVar5);
    fmt::BasicWriter<char>::write_decimal<int>
              (&local_258.super_BasicWriter<char>,this->num_solutions_);
    fmt::Buffer<char>::append<char>(local_258.super_BasicWriter<char>.buffer_,".sol","");
    filename_00.data_ = fmt::BasicWriter<char>::c_str(&local_258.super_BasicWriter<char>);
    WriteSolFile<mp::SolutionAdapter<StrictMockProblemBuilder>>(filename_00,&local_2f0);
    fmt::BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter(&local_258);
    SolutionAdapter<StrictMockProblemBuilder>::~SolutionAdapter(&local_2f0);
  }
  return;
}

Assistant:

void SolutionWriterImpl<Solver, PB, Writer>::
HandleFeasibleSolution(
    int status, fmt::CStringRef message, const double *values,
    const double *dual_values, double) {
  ++num_solutions_;
  const char *solution_stub = solver_.solution_stub();
  if (!*solution_stub)
    return;
  SolutionAdapter<PB> sol(
        status, &builder_, message.c_str(), options_,
        MakeArrayRef(values, values ? builder_.num_vars() : 0),
        MakeArrayRef(dual_values,
                     dual_values ? builder_.num_algebraic_cons() : 0),
        solver_.objno_used());
  fmt::MemoryWriter filename;
  filename << solution_stub << num_solutions_ << ".sol";
  this->Write(filename.c_str(), sol);
}